

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O2

void __thiscall
QSslConfiguration::setMissingCertificateIsFatal(QSslConfiguration *this,bool cannotRecover)

{
  QSslConfigurationPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QSslConfigurationPrivate>::operator->(&this->d);
  pQVar1->missingCertIsFatal = cannotRecover;
  return;
}

Assistant:

void QSslConfiguration::setMissingCertificateIsFatal(bool cannotRecover)
{
#if QT_CONFIG(openssl)
    d->missingCertIsFatal = cannotRecover;
#else
    Q_UNUSED(cannotRecover);
    qCWarning(lcSsl, "Handling a missing certificate as a fatal error requires an OpenSSL backend");
#endif // openssl
}